

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O1

void __thiscall
stackjit::ByteCodeParser::parseInstruction(ByteCodeParser *this,Function *currentFunction)

{
  char *pcVar1;
  OpCodes opCode;
  pointer pbVar2;
  string *psVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  const_iterator cVar8;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar9;
  AttributeContainer *container;
  int *piVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  mapped_type *pmVar12;
  size_t sVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  long lVar15;
  runtime_error *prVar16;
  long *plVar17;
  long *plVar18;
  _Alloc_hider _Var19;
  bool bVar20;
  string localType;
  string value;
  string currentToLower;
  string classType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  undefined1 local_278 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  _Alloc_hider local_230;
  char local_220 [16];
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  float local_1ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  currentTokenToLower_abi_cxx11_(&local_1f0,this);
  iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar5 == 0) {
    container = Loader::Function::attributes_abi_cxx11_(currentFunction);
    parseAttribute(this,container);
    goto LAB_0011f539;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar5 == 0) {
    nextToken_abi_cxx11_((string *)local_278,this);
    uVar4 = local_278._0_8_;
    piVar10 = __errno_location();
    iVar5 = *piVar10;
    *piVar10 = 0;
    lVar15 = strtol((char *)uVar4,(char **)&local_210,10);
    if (local_210._M_dataplus._M_p == (pointer)uVar4) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar15 == lVar15) && (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar5;
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
      pvVar9 = Loader::Function::instructions(currentFunction);
      Loader::Instruction::makeWithInt((Instruction *)local_278,LOAD_INT,(int)lVar15);
      std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
      emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
      goto LAB_0011f506;
    }
    std::__throw_out_of_range("stoi");
LAB_00120052:
    std::__throw_invalid_argument("stof");
LAB_0012005e:
    std::__throw_out_of_range(anon_var_dwarf_69);
LAB_0012006a:
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar5 == 0) {
      nextToken_abi_cxx11_((string *)local_278,this);
      uVar4 = local_278._0_8_;
      this = (ByteCodeParser *)__errno_location();
      iVar5 = *(int *)&(this->mTokens).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      *(int *)&(this->mTokens).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start = 0;
      local_1ac = strtof((char *)uVar4,(char **)&local_210);
      if (local_210._M_dataplus._M_p != (pointer)uVar4) {
        iVar7 = *(int *)&(this->mTokens).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        if (iVar7 == 0) {
          *(int *)&(this->mTokens).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start = iVar5;
        }
        else if (iVar7 == 0x22) {
          std::__throw_out_of_range("stof");
          goto LAB_0011f428;
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        pvVar9 = Loader::Function::instructions(currentFunction);
        Loader::Instruction::makeWithFloat(LOAD_FLOAT,local_1ac);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
LAB_0011f506:
        if (local_230._M_p != local_220) {
          operator_delete(local_230._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        paVar11 = &local_258;
        local_278._0_8_ = local_278._16_8_;
LAB_0011f52f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ == paVar11) goto LAB_0011f539;
LAB_0011f534:
        operator_delete((void *)local_278._0_8_);
LAB_0011f539:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        return;
      }
      goto LAB_00120052;
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar5 != 0) {
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,&local_1f0);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_true>
          ._M_cur == (__node_type *)0x0) {
        cVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,&local_1f0);
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_true>
            ._M_cur != (__node_type *)0x0) {
          nextToken_abi_cxx11_(&local_210,this);
          pvVar9 = Loader::Function::instructions(currentFunction);
          pmVar12 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                          *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,&local_1f0);
          opCode = *pmVar12;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_210._M_dataplus._M_p,
                     local_210._M_dataplus._M_p + local_210._M_string_length);
          Loader::Instruction::makeWithString((Instruction *)local_278,opCode,&local_70);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
          Loader::Instruction::~Instruction((Instruction *)local_278);
          _Var19._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0011f607:
            operator_delete(_Var19._M_p);
          }
          goto LAB_0011f60c;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar5 == 0) {
          if (this->mLocalsSet != false) {
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar16,"The locals has already been set.");
LAB_0012017f:
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          nextToken_abi_cxx11_((string *)local_278,this);
          iVar5 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_);
          }
          if (iVar5 < 0) {
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar16,"The number of locals must be >= 0.");
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this->mLocalsSet = true;
          Loader::Function::setNumLocals(currentFunction,iVar5);
          goto LAB_0011f539;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
          if ((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare((char *)&local_1f0), iVar5 == 0)) {
            if (this->mLocalsSet == false) {
              prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar16,"The locals must be set.");
              goto LAB_0012017f;
            }
            nextToken_abi_cxx11_((string *)local_278,this);
            iVar5 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_);
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_1f0);
            if ((iVar5 < 0) ||
               (sVar13 = Loader::Function::numLocals(currentFunction), (int)sVar13 <= iVar5))
            goto LAB_00120082;
            pvVar9 = Loader::Function::instructions(currentFunction);
            Loader::Instruction::makeWithInt
                      ((Instruction *)local_278,STORE_LOCAL - (iVar7 == 0),iVar5);
            std::
            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
            emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
            if (((iVar5 == 0) ||
                (iVar5 = std::__cxx11::string::compare((char *)&local_1f0), iVar5 == 0)) ||
               (iVar5 = std::__cxx11::string::compare((char *)&local_1f0), iVar5 == 0)) {
              iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
              if (iVar5 == 0) {
                bVar20 = true;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
                bVar20 = iVar5 == 0;
              }
              iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
              nextToken_abi_cxx11_(&local_210,this);
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
              if (bVar20) {
                lVar15 = std::__cxx11::string::find((char *)&local_210,0x1241bf,0);
                if (lVar15 == -1) {
                  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar16,"Expected \'::\' in called member function.");
                  __cxa_throw(prVar16,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_210);
                std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_278);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_);
                }
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_210);
                std::__cxx11::string::operator=((string *)&local_210,(string *)local_278);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_);
                }
              }
              nextToken_abi_cxx11_((string *)local_278,this);
              iVar7 = std::__cxx11::string::compare(local_278);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_);
              }
              if (iVar7 != 0) goto LAB_001201a3;
              local_1a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              readCallParameters(this,&local_1a8);
              if (bVar20) {
                if (iVar5 == 0) {
                  pvVar9 = Loader::Function::instructions(currentFunction);
                  paVar11 = &local_d0.field_2;
                  local_d0._M_dataplus._M_p = (pointer)paVar11;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d0,local_1d0._M_dataplus._M_p,
                             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f0,local_210._M_dataplus._M_p,
                             local_210._M_dataplus._M_p + local_210._M_string_length);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_160,&local_1a8);
                  Loader::Instruction::makeCallVirtual
                            ((Instruction *)local_278,&local_d0,&local_f0,&local_160);
                  std::
                  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                  ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
                  Loader::Instruction::~Instruction((Instruction *)local_278);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_160);
                  _Var19._M_p = local_d0._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p);
                    _Var19._M_p = local_d0._M_dataplus._M_p;
                  }
                }
                else {
                  pvVar9 = Loader::Function::instructions(currentFunction);
                  paVar11 = &local_90.field_2;
                  local_90._M_dataplus._M_p = (pointer)paVar11;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_90,local_1d0._M_dataplus._M_p,
                             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
                  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_b0,local_210._M_dataplus._M_p,
                             local_210._M_dataplus._M_p + local_210._M_string_length);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_148,&local_1a8);
                  Loader::Instruction::makeCallInstance
                            ((Instruction *)local_278,&local_90,&local_b0,&local_148);
                  std::
                  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                  ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
                  Loader::Instruction::~Instruction((Instruction *)local_278);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_148);
                  _Var19._M_p = local_90._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                    _Var19._M_p = local_90._M_dataplus._M_p;
                  }
                }
              }
              else {
                pvVar9 = Loader::Function::instructions(currentFunction);
                paVar11 = &local_110.field_2;
                local_110._M_dataplus._M_p = (pointer)paVar11;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,local_210._M_dataplus._M_p,
                           local_210._M_dataplus._M_p + local_210._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_178,&local_1a8);
                Loader::Instruction::makeCall((Instruction *)local_278,&local_110,&local_178);
                std::
                vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
                Loader::Instruction::~Instruction((Instruction *)local_278);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_178);
                _Var19._M_p = local_110._M_dataplus._M_p;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var19._M_p != paVar11) {
                operator_delete(_Var19._M_p);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1a8);
              _Var19._M_p = local_1d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_0011f607;
LAB_0011f60c:
              psVar3 = &local_210;
LAB_0011f611:
              paVar11 = &psVar3->field_2;
              local_278._0_8_ = *(undefined8 *)(paVar11->_M_local_buf + -0x10);
              goto LAB_0011f52f;
            }
            iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
            if (iVar5 == 0) {
              nextToken_abi_cxx11_((string *)local_278,this);
              iVar5 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_);
              }
              pvVar9 = Loader::Function::instructions(currentFunction);
              Loader::Instruction::makeWithInt((Instruction *)local_278,LOAD_ARG,iVar5);
              std::
              vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
              ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
              if (iVar5 == 0) {
                nextToken_abi_cxx11_(&local_210,this);
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
                lVar15 = std::__cxx11::string::find((char *)&local_210,0x1241bf,0);
                if (lVar15 == -1) {
                  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar16,"Expected \'::\' after the type in a new object instruction.");
LAB_00120269:
                  __cxa_throw(prVar16,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_210);
                std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_278);
                pcVar1 = local_278 + 0x10;
                if ((char *)local_278._0_8_ != pcVar1) {
                  operator_delete((void *)local_278._0_8_);
                }
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_210);
                std::__cxx11::string::operator=((string *)&local_210,(string *)local_278);
                if ((char *)local_278._0_8_ != pcVar1) {
                  operator_delete((void *)local_278._0_8_);
                }
                iVar5 = std::__cxx11::string::compare((char *)&local_210);
                if (iVar5 != 0) {
                  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar16,"Expected call to constructor.");
                  goto LAB_00120269;
                }
                nextToken_abi_cxx11_((string *)local_278,this);
                iVar5 = std::__cxx11::string::compare(local_278);
                if ((char *)local_278._0_8_ != pcVar1) {
                  operator_delete((void *)local_278._0_8_);
                }
                if (iVar5 != 0) {
                  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar16,"Expected \'(\' after called function.")
                  ;
                  goto LAB_00120269;
                }
                local_1a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                readCallParameters(this,&local_1a8);
                pvVar9 = Loader::Function::instructions(currentFunction);
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_130,local_1d0._M_dataplus._M_p,
                           local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,&local_1a8);
                Loader::Instruction::makeNewObject((Instruction *)local_278,&local_130,&local_190);
                std::
                vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
                Loader::Instruction::~Instruction((Instruction *)local_278);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_1a8);
                _Var19._M_p = local_1d0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_0011f607;
                goto LAB_0011f60c;
              }
              iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
              if (iVar5 == 0) {
                nextToken_abi_cxx11_((string *)local_278,this);
                iVar5 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_);
                }
                pvVar9 = Loader::Function::instructions(currentFunction);
                Loader::Instruction::makeWithInt((Instruction *)local_278,BRANCH,iVar5);
                std::
                vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
              }
              else {
                cVar8 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)(anonymous_namespace)::branchInstructions_abi_cxx11_,&local_1f0);
                if (cVar8.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
                  if (iVar5 != 0) {
                    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                    pbVar2 = (this->mTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                    _Var19._M_p = pbVar2[this->mTokenIndex]._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1d0,_Var19._M_p,
                               _Var19._M_p + pbVar2[this->mTokenIndex]._M_string_length);
                    std::operator+(&local_210,"\'",&local_1d0);
                    plVar17 = (long *)std::__cxx11::string::append((char *)&local_210);
                    local_278._0_8_ = *plVar17;
                    plVar18 = plVar17 + 2;
                    if ((long *)local_278._0_8_ == plVar18) {
                      local_278._16_8_ = *plVar18;
                      local_278._24_8_ = plVar17[3];
                      local_278._0_8_ = local_278 + 0x10;
                    }
                    else {
                      local_278._16_8_ = *plVar18;
                    }
                    local_278._8_8_ = plVar17[1];
                    *plVar17 = (long)plVar18;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    std::runtime_error::runtime_error(prVar16,(string *)local_278);
                    __cxa_throw(prVar16,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pvVar9 = Loader::Function::instructions(currentFunction);
                  nextToken_abi_cxx11_(&local_50,this);
                  Loader::Instruction::makeWithStringConstant
                            ((Instruction *)local_278,LOAD_STRING,&local_50);
                  std::
                  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                  ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
                  Loader::Instruction::~Instruction((Instruction *)local_278);
                  psVar3 = &local_50;
                  goto LAB_0011f611;
                }
                nextToken_abi_cxx11_((string *)local_278,this);
                iVar5 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_);
                }
                pvVar9 = Loader::Function::instructions(currentFunction);
                pmVar12 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                                *)(anonymous_namespace)::branchInstructions_abi_cxx11_,&local_1f0);
                Loader::Instruction::makeWithInt((Instruction *)local_278,*pmVar12,iVar5);
                std::
                vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                ::emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
              }
            }
          }
          Loader::Instruction::~Instruction((Instruction *)local_278);
          goto LAB_0011f539;
        }
        if (this->mLocalsSet != true) {
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar16,"The locals must been set.");
          goto LAB_0012017f;
        }
        nextToken_abi_cxx11_((string *)local_278,this);
        uVar6 = std::__cxx11::stoi((string *)local_278,(size_t *)0x0,10);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        nextToken_abi_cxx11_((string *)local_278,this);
        if (((int)uVar6 < 0) ||
           (sVar13 = Loader::Function::numLocals(currentFunction), (int)sVar13 <= (int)uVar6)) {
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar16,"Invalid local index.");
          __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar14 = Loader::Function::localTypes_abi_cxx11_(currentFunction);
        pbVar2 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar14->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
            (ulong)uVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001201a3:
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar16,"Expected \'(\' after called function.");
          __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::_M_assign((string *)(pbVar2 + uVar6));
        if ((undefined1 *)local_278._0_8_ == local_278 + 0x10) goto LAB_0011f539;
        goto LAB_0011f534;
      }
      pvVar9 = Loader::Function::instructions(currentFunction);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,&local_1f0);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_true>
          ._M_cur != (__node_type *)0x0) {
        Loader::Instruction::make
                  (*(OpCodes *)
                    ((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_true>
                           ._M_cur + 0x28));
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
        goto LAB_0011f506;
      }
      goto LAB_0012005e;
    }
LAB_0011f428:
    nextToken_abi_cxx11_((string *)local_278,this);
    uVar4 = local_278._0_8_;
    piVar10 = __errno_location();
    iVar5 = *piVar10;
    *piVar10 = 0;
    lVar15 = strtol((char *)uVar4,(char **)&local_210,10);
    if (local_210._M_dataplus._M_p == (pointer)uVar4) goto LAB_0012006a;
    if (((int)lVar15 == lVar15) && (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar5;
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
      pvVar9 = Loader::Function::instructions(currentFunction);
      Loader::Instruction::makeWithChar((Instruction *)local_278,LOAD_CHAR,(char)lVar15);
      std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
      emplace_back<stackjit::Loader::Instruction>(pvVar9,(Instruction *)local_278);
      goto LAB_0011f506;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_00120082:
  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar16,"The local index is out of range.");
  __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ByteCodeParser::parseInstruction(Loader::Function& currentFunction) {
		using namespace Loader;
		auto currentToLower = currentTokenToLower();

		if (currentToLower == "@") {
			parseAttribute(currentFunction.attributes());
			return;
		}

		if (currentToLower == "ldint") {
			int value = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_INT, value));
			return;
		}

		if (currentToLower == "ldfloat") {
			float value = stof(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithFloat(OpCodes::LOAD_FLOAT, value));
			return;
		}

		if (currentToLower == "ldchar") {
			char value = (char)stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithChar(OpCodes::LOAD_CHAR, value));
			return;
		}

		if (noOperandsInstructions.count(currentToLower) > 0) {
			currentFunction.instructions().push_back(Instruction::make(noOperandsInstructions.at(currentToLower)));
			return;
		}

		if (stringOperandInstructions.count(currentToLower) > 0) {
			std::string value = nextToken();
			currentFunction.instructions().push_back(Instruction::makeWithString(stringOperandInstructions.at(currentToLower), value));
			return;
		}

		if (currentToLower == ".locals") {
			if (!mLocalsSet) {
				int localsCount = stoi(nextToken());

				if (localsCount >= 0) {
					mLocalsSet = true;
					currentFunction.setNumLocals(localsCount);
				} else {
					throw std::runtime_error("The number of locals must be >= 0.");
				}

				return;
			} else {
				throw std::runtime_error("The locals has already been set.");
			}
		}

		if (currentToLower == ".local") {
			if (mLocalsSet) {
				int localIndex = stoi(nextToken());
				auto localType = nextToken();

				if (localIndex >= 0 && localIndex < (int)currentFunction.numLocals()) {
					currentFunction.localTypes().at((std::size_t)localIndex) = localType;
				} else {
					throw std::runtime_error("Invalid local index.");
				}

				return;
			} else {
				throw std::runtime_error("The locals must been set.");
			}
		}

		if (currentToLower == "ldloc" || currentToLower == "stloc") {
			if (!mLocalsSet) {
				throw std::runtime_error("The locals must be set.");
			}

			int local = stoi(nextToken());
			auto opCode = currentToLower == "ldloc" ? OpCodes::LOAD_LOCAL : OpCodes::STORE_LOCAL;

			if (local >= 0 && local < (int)currentFunction.numLocals()) {
				currentFunction.instructions().push_back(Instruction::makeWithInt(opCode, local));
				return;
			} else {
				throw std::runtime_error("The local index is out of range.");
			}
		}

		if (currentToLower == "call" || currentToLower == "callinst" || currentToLower == "callvirt") {
			bool isInstance = currentToLower == "callinst" || currentToLower == "callvirt";
			bool isVirtual = currentToLower == "callvirt";

			auto funcName = nextToken();
			std::string classType = "";

			if (isInstance) {
				auto classNamePosition = funcName.find("::");
				if (classNamePosition != std::string::npos) {
					classType = funcName.substr(0, classNamePosition);
				} else {
					throw std::runtime_error("Expected '::' in called member function.");
				}

				funcName = funcName.substr(classNamePosition + 2);
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);

			if (isInstance) {
				if (!isVirtual) {
					currentFunction.instructions().push_back(Instruction::makeCallInstance(classType, funcName, parameters));
				} else {
					currentFunction.instructions().push_back(Instruction::makeCallVirtual(classType, funcName, parameters));
				}
			} else {
				currentFunction.instructions().push_back(Instruction::makeCall(funcName, parameters));
			}

			return;
		}

		if (currentToLower == "ldarg") {
			int argumentNum = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_ARG, argumentNum));
			return;
		}

		if (currentToLower == "newobj") {
			auto funcName = nextToken();
			std::string classType = "";

			auto classNamePosition = funcName.find("::");
			if (classNamePosition != std::string::npos) {
				classType = funcName.substr(0, classNamePosition);
			} else {
				throw std::runtime_error("Expected '::' after the type in a new object instruction.");
			}

			funcName = funcName.substr(classNamePosition + 2);

			if (funcName != ".constructor") {
				throw std::runtime_error("Expected call to constructor.");
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);
			currentFunction.instructions().push_back(Instruction::makeNewObject(classType, parameters));
			return;
		}

		if (currentToLower == "br") {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::BRANCH, target));
			return;
		}

		if (branchInstructions.count(currentToLower) > 0) {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(branchInstructions.at(currentToLower), target));
			return;
		}

		if (currentToLower == "ldstr") {
			currentFunction.instructions().push_back(Instruction::makeWithStringConstant(OpCodes::LOAD_STRING, nextToken()));
			return;
		}

		throw std::runtime_error("'" + currentToken() + "' is not a valid instruction.");
	}